

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signals.cpp
# Opt level: O0

void llvm::sys::RunSignalHandlers(void)

{
  bool bVar1;
  Status local_1c;
  Status Desired;
  Status Expected;
  CallbackAndCookie *RunMe;
  size_t I;
  
  for (RunMe = (CallbackAndCookie *)0x0; RunMe < (CallbackAndCookie *)0x8;
      RunMe = (CallbackAndCookie *)((long)&RunMe->Callback + 1)) {
    _Desired = CallBacksToRun + (long)RunMe;
    local_1c = Initialized;
    bVar1 = std::atomic<CallbackAndCookie::Status>::compare_exchange_strong
                      (&CallBacksToRun[(long)RunMe].Flag,&local_1c,Executing,memory_order_seq_cst);
    if (bVar1) {
      (*_Desired->Callback)(_Desired->Cookie);
      _Desired->Callback = (SignalHandlerCallback)0x0;
      _Desired->Cookie = (void *)0x0;
      std::atomic<CallbackAndCookie::Status>::store(&_Desired->Flag,Empty,memory_order_seq_cst);
    }
  }
  return;
}

Assistant:

void sys::RunSignalHandlers() {
  for (size_t I = 0; I < MaxSignalHandlerCallbacks; ++I) {
    auto &RunMe = CallBacksToRun[I];
    auto Expected = CallbackAndCookie::Status::Initialized;
    auto Desired = CallbackAndCookie::Status::Executing;
    if (!RunMe.Flag.compare_exchange_strong(Expected, Desired))
      continue;
    (*RunMe.Callback)(RunMe.Cookie);
    RunMe.Callback = nullptr;
    RunMe.Cookie = nullptr;
    RunMe.Flag.store(CallbackAndCookie::Status::Empty);
  }
}